

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::ConfidentialTransactionContext::CollectInputUtxo
          (ConfidentialTransactionContext *this,
          vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *utxos)

{
  pointer *utxo_data;
  pointer pUVar1;
  pointer pUVar2;
  pointer pCVar3;
  bool bVar4;
  uint32_t uVar5;
  pointer this_00;
  Txid *this_01;
  OutPoint outpoint;
  Utxo temp;
  UtxoData dest;
  Txid local_640;
  OutPoint local_620;
  Utxo local_5f8;
  UtxoData local_520;
  
  if ((utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    pUVar1 = (this->utxo_map_).super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pUVar2 = (this->utxo_map_).super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = core::ConfidentialTransaction::GetTxInCount(&this->super_ConfidentialTransaction);
    if (((long)pUVar1 - (long)pUVar2) / 0x4f0 != (ulong)uVar5) {
      pCVar3 = (this->super_ConfidentialTransaction).vin_.
               super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this_00 = (this->super_ConfidentialTransaction).vin_.
                     super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_00 != pCVar3;
          this_00 = this_00 + 1) {
        core::AbstractTxIn::GetTxid(&local_640,&this_00->super_AbstractTxIn);
        uVar5 = core::AbstractTxIn::GetVout(&this_00->super_AbstractTxIn);
        core::OutPoint::OutPoint(&local_620,&local_640,uVar5);
        bVar4 = IsFindUtxoMap(this,&local_620,(UtxoData *)0x0);
        if (!bVar4) {
          pUVar1 = (utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          this_01 = &((utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
                      _M_impl.super__Vector_impl_data._M_start)->txid;
          while (utxo_data = &this_01[-2].data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                (pointer)utxo_data != pUVar1) {
            if (*(uint32_t *)&this_01[1]._vptr_Txid == uVar5) {
              bVar4 = core::Txid::Equals(this_01,&local_640);
              if (bVar4) {
                UtxoData::UtxoData(&local_520);
                memset(&local_5f8,0,0xd8);
                UtxoUtil::ConvertToUtxo((UtxoData *)utxo_data,&local_5f8,&local_520);
                std::vector<cfd::UtxoData,std::allocator<cfd::UtxoData>>::
                emplace_back<cfd::UtxoData&>
                          ((vector<cfd::UtxoData,std::allocator<cfd::UtxoData>> *)&this->utxo_map_,
                           &local_520);
                UtxoData::~UtxoData(&local_520);
                break;
              }
            }
            this_01 = (Txid *)&this_01[0x27].data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
          }
        }
        core::Txid::~Txid(&local_620.txid_);
        core::Txid::~Txid(&local_640);
      }
    }
  }
  return;
}

Assistant:

void ConfidentialTransactionContext::CollectInputUtxo(
    const std::vector<UtxoData>& utxos) {
  if ((!utxos.empty()) && (utxo_map_.size() != GetTxInCount())) {
    for (const auto& txin_ref : vin_) {
      const Txid& txid = txin_ref.GetTxid();
      uint32_t vout = txin_ref.GetVout();

      OutPoint outpoint(txid, vout);
      if (!IsFindUtxoMap(outpoint)) {
        for (const auto& utxo : utxos) {
          if ((utxo.vout == vout) && utxo.txid.Equals(txid)) {
            UtxoData dest;
            Utxo temp;
            memset(&temp, 0, sizeof(temp));
            UtxoUtil::ConvertToUtxo(utxo, &temp, &dest);
            utxo_map_.emplace_back(dest);
            break;
          }
        }
      }
    }
  }
}